

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall absl::lts_20250127::log_internal::LogMessage::~LogMessage(LogMessage *this)

{
  LogMessage *this_local;
  
  Flush(this);
  std::
  unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ::~unique_ptr(&this->data_);
  base_internal::ErrnoSaver::~ErrnoSaver(&this->errno_saver_);
  return;
}

Assistant:

LogMessage::~LogMessage() {
#ifdef ABSL_MIN_LOG_LEVEL
  if (data_->entry.log_severity() <
          static_cast<absl::LogSeverity>(ABSL_MIN_LOG_LEVEL) &&
      data_->entry.log_severity() < absl::LogSeverity::kFatal) {
    return;
  }
#endif
  Flush();
}